

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

BSDF * __thiscall
pbrt::DiffuseTransmissionMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (void *param_1,long param_2,undefined8 *param_3,void *param_4)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  SampledWavelengths lambda;
  SampledWavelengths lambda_00;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar14 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar15;
  Float s;
  SampledSpectrum t;
  SampledSpectrum r;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 in_stack_fffffffffffffd48 [64];
  Float eta;
  BxDFHandle *bxdf;
  Vector3f *dpdus;
  Normal3f *ns;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 uVar18;
  Vector3f *wo;
  BSDF *this;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 (*__src) [64];
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  BSDF *pBVar22;
  SpectrumTextureHandle *in_stack_fffffffffffffe18;
  UniversalTextureEvaluator *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe40;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 in_stack_fffffffffffffe48 [56];
  undefined8 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe88 [12];
  undefined4 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffe98;
  BSDF local_100;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [64];
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  long local_18;
  undefined1 local_9 [9];
  
  __src = (undefined1 (*) [64])&stack0x00000008;
  uVar18 = *(undefined4 *)(param_2 + 0x20);
  ns = (Normal3f *)local_60;
  pBVar22 = (BSDF *)param_1;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_9._1_8_ = param_1;
  SpectrumTextureHandle::SpectrumTextureHandle
            (in_stack_fffffffffffffd48._8_8_,in_stack_fffffffffffffd48._0_8_);
  auVar7 = vmovdqu64_avx512f(*__src);
  local_a8 = vmovdqu64_avx512f(auVar7);
  local_100.ng.super_Tuple3<pbrt::Normal3,_float>._4_8_ = *local_20;
  uStack_c0 = local_20[1];
  uStack_b8 = local_20[2];
  uStack_b0 = local_20[3];
  auVar8 = vmovdqu64_avx512f(local_a8);
  auVar7 = vmovdqu64_avx512f(auVar8);
  auVar16 = auVar7._0_16_;
  wo = (Vector3f *)local_9;
  auVar14 = ZEXT856(auVar8._8_8_);
  auVar23 = in_stack_fffffffffffffe48._4_12_;
  auVar24 = in_stack_fffffffffffffe48._16_12_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)in_stack_fffffffffffffe48._0_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar23._0_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar23._4_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar23._8_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar24._0_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar24._4_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar24._8_4_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffe48._28_8_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffe48._28_8_ >> 0x20);
  ctx_00.dudx = (Float)in_stack_fffffffffffffe48._36_4_;
  ctx_00.dudy = (Float)in_stack_fffffffffffffe48._40_4_;
  ctx_00.dvdx = (Float)in_stack_fffffffffffffe48._44_4_;
  ctx_00.dvdy = (Float)in_stack_fffffffffffffe48._48_4_;
  ctx_00.faceIndex = in_stack_fffffffffffffe48._52_4_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffe40;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  lambda.lambda.values[2] = (float)in_stack_fffffffffffffe88._0_4_;
  lambda.lambda.values[3] = (float)in_stack_fffffffffffffe88._4_4_;
  lambda.pdf.values[0] = (float)in_stack_fffffffffffffe88._8_4_;
  lambda.lambda.values[0] = (float)(int)in_stack_fffffffffffffe80;
  lambda.lambda.values[1] = (float)(int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  lambda.pdf.values[1] = (float)in_stack_fffffffffffffe94;
  lambda.pdf.values[2] = (float)(int)in_stack_fffffffffffffe98;
  lambda.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  SVar15 = UniversalTextureEvaluator::operator()
                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,ctx_00,lambda);
  auVar8._0_8_ = SVar15.values.values._0_8_;
  auVar8._8_56_ = auVar14;
  auVar14 = (undefined1  [56])0x0;
  local_60._8_8_ = vmovlpd_avx(auVar8._0_16_);
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = SVar15.values.values._8_8_;
  local_50 = vmovlpd_avx(auVar1);
  SVar15 = pbrt::operator*(auVar16._12_4_,auVar16._0_8_);
  auVar9._0_8_ = SVar15.values.values._0_8_;
  auVar9._8_56_ = auVar14;
  local_48 = vmovlpd_avx(auVar9._0_16_);
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar15.values.values._8_8_;
  local_40 = vmovlpd_avx(auVar2);
  uVar20 = 0;
  uVar21 = 1;
  SVar15 = Clamp<int,int>(auVar16._8_8_,auVar16._4_4_,auVar16._0_4_);
  auVar10._0_8_ = SVar15.values.values._0_8_;
  auVar10._8_56_ = auVar14;
  local_38 = vmovlpd_avx(auVar10._0_16_);
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = SVar15.values.values._8_8_;
  local_30 = vmovlpd_avx(auVar3);
  uVar19 = *(undefined4 *)(param_2 + 0x20);
  this = &local_100;
  SpectrumTextureHandle::SpectrumTextureHandle(auVar16._8_8_,auVar16._0_8_);
  auVar7 = vmovdqu64_avx512f(*__src);
  auVar7 = vmovdqu64_avx512f(auVar7);
  eta = (Float)((ulong)local_20[1] >> 0x20);
  bxdf = (BxDFHandle *)local_20[2];
  dpdus = (Vector3f *)local_20[3];
  auVar8 = vmovdqu64_avx512f(auVar7);
  auVar7 = vmovdqu64_avx512f(auVar8);
  auVar16 = auVar7._0_16_;
  auVar14 = ZEXT856(auVar8._8_8_);
  auVar23 = in_stack_fffffffffffffe48._4_12_;
  auVar24 = in_stack_fffffffffffffe48._16_12_;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)in_stack_fffffffffffffe48._0_4_;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar23._0_4_;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar23._4_4_;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar23._8_4_;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar24._0_4_;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar24._4_4_;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar24._8_4_;
  ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffe48._28_8_;
  ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffe48._28_8_ >> 0x20);
  ctx_01.dudx = (Float)in_stack_fffffffffffffe48._36_4_;
  ctx_01.dudy = (Float)in_stack_fffffffffffffe48._40_4_;
  ctx_01.dvdx = (Float)in_stack_fffffffffffffe48._44_4_;
  ctx_01.dvdy = (Float)in_stack_fffffffffffffe48._48_4_;
  ctx_01.faceIndex = in_stack_fffffffffffffe48._52_4_;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffe40;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  lambda_00.lambda.values[2] = (float)in_stack_fffffffffffffe88._0_4_;
  lambda_00.lambda.values[3] = (float)in_stack_fffffffffffffe88._4_4_;
  lambda_00.pdf.values[0] = (float)in_stack_fffffffffffffe88._8_4_;
  lambda_00.lambda.values[0] = (float)(int)in_stack_fffffffffffffe80;
  lambda_00.lambda.values[1] = (float)(int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  lambda_00.pdf.values[1] = (float)in_stack_fffffffffffffe94;
  lambda_00.pdf.values._8_8_ = *local_20;
  SVar15 = UniversalTextureEvaluator::operator()
                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,ctx_01,lambda_00);
  auVar11._0_8_ = SVar15.values.values._0_8_;
  auVar11._8_56_ = auVar14;
  auVar14 = (undefined1  [56])0x0;
  local_100.bxdf.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )vmovlpd_avx(auVar11._0_16_);
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = SVar15.values.values._8_8_;
  local_100.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlpd_avx(auVar4);
  SVar15 = pbrt::operator*(auVar16._12_4_,auVar16._0_8_);
  auVar12._0_8_ = SVar15.values.values._0_8_;
  auVar12._8_56_ = auVar14;
  local_100.shadingFrame._8_8_ = vmovlpd_avx(auVar12._0_16_);
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = SVar15.values.values._8_8_;
  local_100.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>._4_8_ = vmovlpd_avx(auVar5);
  SVar15 = Clamp<int,int>(auVar16._8_8_,auVar16._4_4_,auVar16._0_4_);
  auVar13._0_8_ = SVar15.values.values._0_8_;
  auVar13._8_56_ = auVar14;
  local_100.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlpd_avx(auVar13._0_16_);
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = SVar15.values.values._8_8_;
  local_100._48_8_ = vmovlpd_avx(auVar6);
  FloatTextureHandle::FloatTextureHandle(auVar16._8_8_,auVar16._0_8_);
  memcpy(&stack0xfffffffffffffe48,__src,0x40);
  auVar7._56_8_ = in_stack_fffffffffffffe80;
  auVar7._0_56_ = in_stack_fffffffffffffe48;
  auVar7 = vmovdqu64_avx512f(auVar7);
  auVar7 = vmovdqu64_avx512f(auVar7);
  auVar17 = auVar7._0_32_;
  ctx._8_8_ = param_1;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = __src;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffdf0;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffdf8;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffe00;
  ctx.uv.super_Tuple2<pbrt::Point2,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffe08;
  ctx.dudx = (Float)(int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  ctx._48_8_ = pBVar22;
  ctx._56_8_ = in_stack_fffffffffffffe18;
  UniversalTextureEvaluator::operator()
            ((UniversalTextureEvaluator *)CONCAT44(uVar21,uVar20),
             (FloatTextureHandle *)CONCAT44(uVar19,in_stack_fffffffffffffdc8),ctx);
  auVar16 = auVar17._0_16_;
  DiffuseBxDF::DiffuseBxDF(auVar17._24_8_,auVar17._16_8_,auVar17._8_8_,auVar17._4_4_);
  memcpy(local_28,&stack0xfffffffffffffe20,0x28);
  BxDFHandle::TaggedPointer<pbrt::DiffuseBxDF>(auVar16._8_8_,auVar16._0_8_);
  BSDF::BSDF(this,wo,(Normal3f *)CONCAT44(uVar18,in_stack_fffffffffffffdb0),ns,dpdus,bxdf,eta);
  return pBVar22;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, DiffuseBxDF *bxdf) const {
        SampledSpectrum r = Clamp(scale * texEval(reflectance, ctx, lambda), 0, 1);
        SampledSpectrum t = Clamp(scale * texEval(transmittance, ctx, lambda), 0, 1);
        Float s = texEval(sigma, ctx);
        *bxdf = DiffuseBxDF(r, t, s);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }